

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O3

void __thiscall
Assimp::COBImporter::UnsupportedChunk_Ascii
          (COBImporter *this,LineSplitter *splitter,ChunkInfo *nfo,char *name)

{
  ostream *poVar1;
  Logger *this_00;
  string error;
  string local_1c0;
  char *local_1a0;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_198 [112];
  ios_base local_128 [264];
  
  local_1a0 = name;
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[32]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
             (char (*) [32])"Encountered unsupported chunk: ");
  poVar1 = (ostream *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (local_198,&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," [version: ",0xb);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", size: ",8);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  if (nfo->size != 0xffffffff) {
    this_00 = DefaultLogger::get();
    Logger::error(this_00,local_1c0._M_dataplus._M_p);
    StreamReader<false,_false>::IncPtr(splitter->mStream,(ulong)nfo->size);
    splitter->mSwallow = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p);
    }
    return;
  }
  ThrowException(&local_1c0);
}

Assistant:

void COBImporter::UnsupportedChunk_Ascii(LineSplitter& splitter, const ChunkInfo& nfo, const char* name)
{
    const std::string error = format("Encountered unsupported chunk: ") <<  name <<
        " [version: "<<nfo.version<<", size: "<<nfo.size<<"]";

    // we can recover if the chunk size was specified.
    if(nfo.size != static_cast<unsigned int>(-1)) {
        ASSIMP_LOG_ERROR(error);

        // (HACK) - our current position in the stream is the beginning of the
        // head line of the next chunk. That's fine, but the caller is going
        // to call ++ on `splitter`, which we need to swallow to avoid
        // missing the next line.
        splitter.get_stream().IncPtr(nfo.size);
        splitter.swallow_next_increment();
    }
    else ThrowException(error);
}